

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O3

int lre_exec(uint8_t **capture,uint8_t *bc_buf,uint8_t *cbuf,int cindex,int clen,int cbuf_type,
            void *opaque)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  undefined8 opaque_00;
  size_t ptr;
  intptr_t iVar4;
  undefined8 uStack_a0;
  BOOL aBStack_98 [2];
  uint8_t *puStack_90;
  undefined1 local_88 [8];
  REExecContext s_s;
  
  bVar1 = *bc_buf;
  s_s.capture_count = bVar1 >> 2 & 1;
  s_s.stack_size_max = bVar1 >> 1 & 1;
  s_s.cbuf_end._0_4_ = 2;
  if ((bVar1 >> 4 & 1) == 0) {
    s_s.cbuf_end._0_4_ = cbuf_type;
  }
  s_s.multi_line = bVar1 >> 4 & 1;
  if (cbuf_type != 1) {
    s_s.cbuf_end._0_4_ = cbuf_type;
  }
  bVar1 = bc_buf[1];
  s_s.cbuf_end._4_4_ = (uint)bVar1;
  bVar2 = bc_buf[2];
  s_s.cbuf_type = (uint)bVar2;
  local_88 = (undefined1  [8])cbuf;
  s_s.cbuf = cbuf + (clen << ((byte)cbuf_type & 0x1f));
  s_s._32_8_ = opaque;
  s_s.opaque = (void *)((ulong)bVar1 * 0x10 + 0x20 + (ulong)bVar2 * 8);
  s_s.state_size = 0;
  s_s.state_stack = (uint8_t *)0x0;
  s_s.state_stack_size = 0;
  if (bVar1 != 0) {
    puStack_90 = (uint8_t *)0x16ded2;
    s_s.state_stack_len = (size_t)cbuf;
    memset(capture,0,(ulong)((uint)bVar1 * 2 - 2) * 8 + 0x10);
    cbuf = (uint8_t *)s_s.state_stack_len;
  }
  lVar3 = -(ulong)((uint)bVar2 * 8 + 0xf & 0xfffffff0);
  *(undefined8 *)((long)aBStack_98 + lVar3) = 0;
  *(undefined8 *)((long)&uStack_a0 + lVar3) = 0x16df19;
  iVar4 = lre_exec_backtrack((REExecContext *)local_88,capture,(StackInt *)(local_88 + lVar3),0,
                             bc_buf + 7,cbuf + (cindex << ((byte)cbuf_type & 0x1f)),
                             *(BOOL *)((long)aBStack_98 + lVar3));
  ptr = s_s.state_size;
  opaque_00 = s_s._32_8_;
  *(undefined8 *)((long)&puStack_90 + lVar3) = 0x16df31;
  lre_realloc((void *)opaque_00,(void *)ptr,0);
  return (int)iVar4;
}

Assistant:

int lre_exec(uint8_t **capture,
             const uint8_t *bc_buf, const uint8_t *cbuf, int cindex, int clen,
             int cbuf_type, void *opaque)
{
    REExecContext s_s, *s = &s_s;
    int re_flags, i, alloca_size, ret;
    StackInt *stack_buf;
    
    re_flags = bc_buf[RE_HEADER_FLAGS];
    s->multi_line = (re_flags & LRE_FLAG_MULTILINE) != 0;
    s->ignore_case = (re_flags & LRE_FLAG_IGNORECASE) != 0;
    s->is_utf16 = (re_flags & LRE_FLAG_UTF16) != 0;
    s->capture_count = bc_buf[RE_HEADER_CAPTURE_COUNT];
    s->stack_size_max = bc_buf[RE_HEADER_STACK_SIZE];
    s->cbuf = cbuf;
    s->cbuf_end = cbuf + (clen << cbuf_type);
    s->cbuf_type = cbuf_type;
    if (s->cbuf_type == 1 && s->is_utf16)
        s->cbuf_type = 2;
    s->opaque = opaque;

    s->state_size = sizeof(REExecState) +
        s->capture_count * sizeof(capture[0]) * 2 +
        s->stack_size_max * sizeof(stack_buf[0]);
    s->state_stack = NULL;
    s->state_stack_len = 0;
    s->state_stack_size = 0;
    
    for(i = 0; i < s->capture_count * 2; i++)
        capture[i] = NULL;
    alloca_size = s->stack_size_max * sizeof(stack_buf[0]);
    stack_buf = alloca(alloca_size);
    ret = lre_exec_backtrack(s, capture, stack_buf, 0, bc_buf + RE_HEADER_LEN,
                             cbuf + (cindex << cbuf_type), FALSE);
    lre_realloc(s->opaque, s->state_stack, 0);
    return ret;
}